

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O1

bool __thiscall hwnet::Poller::Init(Poller *this,ThreadPool *pool)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  ThreadPool *this_00;
  notifyChannel *pnVar4;
  bool bVar5;
  notifyChannel *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  this_00 = pool;
  if (pool == (ThreadPool *)0x0) {
    this_00 = (ThreadPool *)operator_new(0xe0);
    (this_00->inited)._M_base._M_i = false;
    ThreadPool::TaskQueue::TaskQueue(&this_00->queue_);
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar3 = std::thread::hardware_concurrency();
    ThreadPool::Init(this_00,iVar3 * 2,0);
  }
  LOCK();
  bVar5 = (this->inited)._M_base._M_i == false;
  if (bVar5) {
    (this->inited)._M_base._M_i = true;
  }
  UNLOCK();
  if (bVar5) {
    this->pool_ = this_00;
    bVar5 = Epoll::Init(&this->poller_);
    if (bVar5) {
      pnVar4 = (notifyChannel *)operator_new(0x28);
      (pnVar4->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pnVar4->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pnVar4->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_0012b808;
      local_48 = pnVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<hwnet::Poller::notifyChannel*>
                (a_Stack_40,pnVar4);
      std::__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2>::
      _M_enable_shared_from_this_with<hwnet::Poller::notifyChannel,hwnet::Poller::notifyChannel>
                ((__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 pnVar4);
      _Var2._M_pi = a_Stack_40[0]._M_pi;
      pnVar4 = local_48;
      local_48 = (notifyChannel *)0x0;
      a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->notifyChannel_).
               super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pnVar4;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = _Var2._M_pi;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      }
      iVar3 = notifyChannel::init((this->notifyChannel_).
                                  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(EVP_PKEY_CTX *)this);
      if ((char)iVar3 != '\0') {
        this->poolCreateByNew = pool == (ThreadPool *)0x0;
        return true;
      }
      if (pool == (ThreadPool *)0x0) {
        ThreadPool::~ThreadPool(this_00);
        operator_delete(this_00,0xe0);
      }
      this->pool_ = (ThreadPool *)0x0;
      p_Var1 = (this->notifyChannel_).
               super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->notifyChannel_).
      super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
    }
    else {
      if (pool == (ThreadPool *)0x0) {
        ThreadPool::~ThreadPool(this_00);
        operator_delete(this_00,0xe0);
      }
      this->pool_ = (ThreadPool *)0x0;
    }
  }
  else if (pool == (ThreadPool *)0x0) {
    ThreadPool::~ThreadPool(this_00);
    operator_delete(this_00,0xe0);
  }
  return false;
}

Assistant:

bool Poller::Init(ThreadPool *pool) {

	auto poolCreateByNew_ = false;

	if(nullptr == pool) {
		pool = new ThreadPool;
		pool->Init(std::thread::hardware_concurrency()*2);
		poolCreateByNew_ = true;
	}

	bool expected = false;
	if(!this->inited.compare_exchange_strong(expected,true)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		return false;
	}

	this->pool_ = pool;

	if(!poller_.Init()) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		return false;
	}

	this->notifyChannel_ = notifyChannel::Ptr(new notifyChannel);

	if(!this->notifyChannel_->init(this)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		this->notifyChannel_ = nullptr;
		return false;
	}

	this->poolCreateByNew = poolCreateByNew_;

	return true;	
}